

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_set_format_mtree_default(archive *_a,char *fn)

{
  long lVar1;
  int iVar2;
  mtree_writer *mtree_00;
  int magic_test;
  mtree_writer *mtree;
  archive_write *a;
  char *fn_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,fn);
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].magic;
    lVar1._4_4_ = _a[2].state;
    if (lVar1 != 0) {
      (**(code **)(_a + 2))(_a);
    }
    mtree_00 = (mtree_writer *)calloc(1,0x130);
    if (mtree_00 == (mtree_writer *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate mtree data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      mtree_00->mtree_entry = (mtree_entry_conflict *)0x0;
      mtree_00->first = 1;
      memset(&mtree_00->set,0,0x38);
      mtree_00->keys = 0x3d863a;
      mtree_00->dironly = 0;
      mtree_00->indent = 0;
      (mtree_00->ebuf).s = (char *)0x0;
      (mtree_00->ebuf).length = 0;
      (mtree_00->ebuf).buffer_length = 0;
      (mtree_00->buf).s = (char *)0x0;
      (mtree_00->buf).length = 0;
      (mtree_00->buf).buffer_length = 0;
      mtree_entry_register_init(mtree_00);
      *(mtree_writer **)&_a[1].current_codepage = mtree_00;
      *(code **)(_a + 2) = archive_write_mtree_free;
      _a[1].sconv = (archive_string_conv *)0x790f75;
      _a[1].read_data_offset = (int64_t)archive_write_mtree_options;
      _a[1].read_data_remaining = (size_t)archive_write_mtree_header;
      _a[1].read_data_requested = (size_t)archive_write_mtree_close;
      *(code **)&_a[1].read_data_is_posix_read = archive_write_mtree_data;
      _a[1].read_data_output_offset = (int64_t)archive_write_mtree_finish_entry;
      _a->archive_format = 0x80000;
      _a->archive_format_name = "mtree";
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

static int
archive_write_set_format_mtree_default(struct archive *_a, const char *fn)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct mtree_writer *mtree;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC, ARCHIVE_STATE_NEW, fn);

	if (a->format_free != NULL)
		(a->format_free)(a);

	if ((mtree = calloc(1, sizeof(*mtree))) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate mtree data");
		return (ARCHIVE_FATAL);
	}

	mtree->mtree_entry = NULL;
	mtree->first = 1;
	memset(&(mtree->set), 0, sizeof(mtree->set));
	mtree->keys = DEFAULT_KEYS;
	mtree->dironly = 0;
	mtree->indent = 0;
	archive_string_init(&mtree->ebuf);
	archive_string_init(&mtree->buf);
	mtree_entry_register_init(mtree);
	a->format_data = mtree;
	a->format_free = archive_write_mtree_free;
	a->format_name = "mtree";
	a->format_options = archive_write_mtree_options;
	a->format_write_header = archive_write_mtree_header;
	a->format_close = archive_write_mtree_close;
	a->format_write_data = archive_write_mtree_data;
	a->format_finish_entry = archive_write_mtree_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_MTREE;
	a->archive.archive_format_name = "mtree";

	return (ARCHIVE_OK);
}